

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_ss.c
# Opt level: O0

int sinkPutbuf(gdIOCtx *ctx,void *buf,int size)

{
  int res;
  ssIOCtxPtr lctx;
  int size_local;
  void *buf_local;
  gdIOCtx *ctx_local;
  
  ctx_local._4_4_ = (**(code **)ctx[1].getBuf)(*(undefined8 *)(ctx[1].getBuf + 8),buf,size);
  if (ctx_local._4_4_ < 1) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int sinkPutbuf(gdIOCtx *ctx, const void *buf, int size)
{
	ssIOCtxPtr lctx;
	int res;

	lctx = (ssIOCtx *)ctx;

	res = (lctx->snk->sink)(lctx->snk->context, buf, size);

	if (res <= 0) {
		return 0;
	} else {
		return res;
	}
}